

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteFieldDocComment(Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  FieldDescriptor::DebugString_abi_cxx11_(&local_40,field);
  FirstLineOf(&local_b0,&local_40);
  EscapeJavadoc((string *)local_90,&local_b0);
  io::Printer::Print(printer,"/**\n * <code>$def$</code>\n","def",(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_90._24_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_90._16_8_ = &local_70;
  local_60._M_p = (pointer)&local_50;
  bVar1 = FieldDescriptor::GetSourceLocation(field,(SourceLocation *)local_90);
  if (bVar1) {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,
                    CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._16_8_ != &local_70) {
    operator_delete((void *)local_90._16_8_,
                    CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1);
  }
  io::Printer::Print(printer," */\n");
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We use the field declaration as the first line of the comment, e.g.:
  //   optional string foo = 5;
  // This communicates a lot of information about the field in a small space.
  // If the field is a group, the debug string might end with {.
  printer->Print(
    "/**\n"
    " * <code>$def$</code>\n",
    "def", EscapeJavadoc(FirstLineOf(field->DebugString())));
  WriteDocCommentBody(printer, field);
  printer->Print(" */\n");
}